

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

bigint * __thiscall fmt::v8::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  size_t sVar2;
  uint *puVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  
  iVar5 = shift + 0x1f;
  if (-1 < shift) {
    iVar5 = shift;
  }
  this->exp_ = this->exp_ + (iVar5 >> 5);
  if (shift % 0x20 != 0) {
    sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
    if (sVar2 == 0) {
      uVar6 = 0;
    }
    else {
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      bVar4 = (byte)(shift % 0x20);
      sVar7 = 0;
      uVar8 = 0;
      do {
        uVar1 = puVar3[sVar7];
        uVar6 = uVar1 >> (0x20 - bVar4 & 0x1f);
        puVar3[sVar7] = (uVar1 << (bVar4 & 0x1f)) + uVar8;
        sVar7 = sVar7 + 1;
        uVar8 = uVar6;
      } while (sVar2 != sVar7);
    }
    if (uVar6 != 0) {
      if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < sVar2 + 1) {
        (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
      }
      puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      sVar2 = (this->bigits_).super_buffer<unsigned_int>.size_;
      (this->bigits_).super_buffer<unsigned_int>.size_ = sVar2 + 1;
      puVar3[sVar2] = uVar6;
    }
  }
  return this;
}

Assistant:

bigint& operator<<=(int shift) {
    FMT_ASSERT(shift >= 0, "");
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }